

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kx.h
# Opt level: O1

int hydro_kx_aead_decrypt(hydro_kx_state *state,uint8_t *m,uint8_t *c,size_t clen)

{
  ulong __n;
  uint *puVar1;
  uint *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uchar *dst_1;
  int iVar10;
  uchar *src;
  ulong uVar11;
  ushort uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [64];
  uint32_t *b1;
  uint32_t int_state [12];
  uint32_t pub_mac [4];
  uint8_t k [32];
  uint local_98 [4];
  uint local_88 [8];
  undefined8 local_68;
  undefined8 uStack_60;
  uint8_t local_58 [40];
  undefined1 auVar14 [16];
  
  __n = clen - 0x10;
  local_68 = *(undefined8 *)c;
  uStack_60 = *(undefined8 *)(c + 8);
  hydro_kx_aead_init((uint8_t *)local_98,local_58,state);
  hydro_hash_update(&state->h_st,c,clen);
  if (__n < 0x10) {
    lVar9 = 0;
  }
  else {
    uVar11 = __n >> 4;
    lVar9 = 0;
    do {
      puVar1 = (uint *)(c + lVar9 + 0x10);
      uVar8 = puVar1[1];
      uVar6 = puVar1[2];
      uVar7 = puVar1[3];
      puVar2 = (uint *)(m + lVar9);
      *puVar2 = local_98[0] ^ *puVar1;
      puVar2[1] = local_98[1] ^ uVar8;
      puVar2[2] = local_98[2] ^ uVar6;
      puVar2[3] = local_98[3] ^ uVar7;
      uVar3 = *(undefined8 *)(c + lVar9 + 0x10);
      uVar4 = *(undefined8 *)(c + lVar9 + 0x10 + 8);
      local_98[0] = (uint)uVar3;
      local_98[1] = (uint)((ulong)uVar3 >> 0x20);
      local_98[2] = (uint)uVar4;
      local_98[3] = (uint)((ulong)uVar4 >> 0x20);
      gimli_core_u8((uint8_t *)local_98,'\x02');
      lVar9 = lVar9 + 0x10;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  uVar11 = clen & 0xf;
  if (uVar11 != 0) {
    auVar15 = vpbroadcastq_avx512f();
    uVar3 = vpcmpuq_avx512f(auVar15,_DAT_00109800,5);
    uVar4 = vpcmpuq_avx512f(auVar15,_DAT_00109840,5);
    bVar5 = (byte)uVar4;
    uVar12 = CONCAT11(bVar5,(byte)uVar3);
    auVar13 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(c + lVar9 + 0x10));
    auVar14[1] = ((byte)(uVar12 >> 1) & 1) * auVar13[1];
    auVar14[0] = ((byte)uVar3 & 1) * auVar13[0];
    auVar14[2] = ((byte)(uVar12 >> 2) & 1) * auVar13[2];
    auVar14[3] = ((byte)(uVar12 >> 3) & 1) * auVar13[3];
    auVar14[4] = ((byte)(uVar12 >> 4) & 1) * auVar13[4];
    auVar14[5] = ((byte)(uVar12 >> 5) & 1) * auVar13[5];
    auVar14[6] = ((byte)(uVar12 >> 6) & 1) * auVar13[6];
    auVar14[7] = ((byte)(uVar12 >> 7) & 1) * auVar13[7];
    auVar14[8] = (bVar5 & 1) * auVar13[8];
    auVar14[9] = (bVar5 >> 1 & 1) * auVar13[9];
    auVar14[10] = (bVar5 >> 2 & 1) * auVar13[10];
    auVar14[0xb] = (bVar5 >> 3 & 1) * auVar13[0xb];
    auVar14[0xc] = (bVar5 >> 4 & 1) * auVar13[0xc];
    auVar14[0xd] = (bVar5 >> 5 & 1) * auVar13[0xd];
    auVar14[0xe] = (bVar5 >> 6 & 1) * auVar13[0xe];
    auVar14[0xf] = -((char)bVar5 >> 7) * auVar13[0xf];
    auVar13._4_4_ = local_98[1];
    auVar13._0_4_ = local_98[0];
    auVar13._8_4_ = local_98[2];
    auVar13._12_4_ = local_98[3];
    auVar13 = vmovdqu8_avx512vl(auVar14 ^ auVar13);
    *(undefined1 (*) [16])(m + lVar9) = auVar13;
    memcpy(local_98,c + lVar9 + 0x10,uVar11);
  }
  *(byte *)((long)local_98 + uVar11) = *(byte *)((long)local_98 + uVar11) ^ 1;
  local_98[3] = local_98[3] ^ 0x80000000;
  gimli_core_u8((uint8_t *)local_98,'\x02');
  hydro_kx_aead_final((uint8_t *)local_98,local_58);
  uVar8 = 0;
  lVar9 = 0;
  do {
    uVar8 = uVar8 | local_88[lVar9] ^ *(uint *)((long)&local_68 + lVar9 * 4);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  lVar9 = 0;
  do {
    local_98[lVar9] = 0;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xc);
  if (uVar8 == 0) {
    iVar10 = 0;
  }
  else {
    iVar10 = -1;
    if (__n != 0) {
      memset(m,0,__n);
    }
  }
  return iVar10;
}

Assistant:

static int
hydro_kx_aead_decrypt(hydro_kx_state *state, uint8_t *m, const uint8_t *c, size_t clen)
{
    _hydro_attr_aligned_(16) uint32_t int_state[gimli_BLOCKBYTES / 4];
    uint32_t                          pub_mac[hydro_kx_AEAD_MACBYTES / 4];
    uint8_t                           k[hydro_kx_AEAD_KEYBYTES];
    uint8_t                          *aead_state = (uint8_t *) (void *) int_state;
    const uint8_t                    *mac;
    const uint8_t                    *ct;
    size_t                            mlen;
    uint32_t                          cv;

    if (clen < hydro_kx_AEAD_MACBYTES) {
        return -1;
    }
    mac  = &c[0];
    ct   = &c[hydro_kx_AEAD_MACBYTES];
    mlen = clen - hydro_kx_AEAD_MACBYTES;
    memcpy(pub_mac, mac, sizeof pub_mac);
    hydro_kx_aead_init(aead_state, k, state);
    hydro_hash_update(&state->h_st, c, clen);
    hydro_kx_aead_xor_dec(aead_state, m, ct, mlen);
    hydro_kx_aead_final(aead_state, k);
    COMPILER_ASSERT(hydro_kx_AEAD_MACBYTES <= gimli_CAPACITY);
    COMPILER_ASSERT(gimli_RATE % 4 == 0);
    cv = hydro_mem_ct_cmp_u32(int_state + gimli_RATE / 4, pub_mac, hydro_kx_AEAD_MACBYTES / 4);
    hydro_mem_ct_zero_u32(int_state, gimli_BLOCKBYTES / 4);
    if (cv != 0) {
        mem_zero(m, mlen);
        return -1;
    }
    return 0;
}